

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
         *this)

{
  Precision PVar1;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar2;
  pointer pVVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CommandLine *this_01;
  TestContext *this_02;
  TestLog *this_03;
  MessageBuilder *pMVar7;
  Statement *pSVar8;
  reference ppFVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_2>_> *pVVar11;
  Variable<vkt::shaderexecutor::Void> *pVVar12;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar13;
  FloatFormat *pFVar14;
  IVal *pIVar15;
  reference pvVar16;
  reference value;
  reference value_00;
  FloatFormat *fmt_00;
  IVal *value_01;
  deUint32 in_stack_ffffffffffffeba8;
  char (*local_12f8) [7];
  pointer local_1230;
  allocator<char> local_11e9;
  string local_11e8;
  undefined4 local_11c8;
  allocator<char> local_11c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c0;
  string local_11a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180;
  MessageBuilder local_1160;
  MessageBuilder local_fe0;
  int local_e5c;
  MessageBuilder local_e58;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  undefined1 local_b18 [8];
  MessageBuilder builder;
  string local_990;
  IVal local_970;
  allocator<char> local_909;
  string local_908;
  undefined1 local_8e8 [32];
  double local_8c8;
  double dStack_8c0;
  undefined1 local_8b8 [8];
  EvalContext ctx;
  IVal local_86e [4];
  IVal local_86a [2];
  IVal local_868;
  IVal local_838;
  undefined1 auStack_808 [8];
  IVal reference1_1;
  undefined1 local_7d0 [8];
  IVal reference0_1;
  pointer pVStack_768;
  bool result;
  size_t valueNdx;
  IVal reference1;
  IVal reference0;
  undefined1 local_6c8 [5];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  MessageBuilder local_670;
  _Self local_4f0;
  _Self local_4e8;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  MessageBuilder local_338;
  reference local_1b8;
  void *outputArr [2];
  void *inputArr [4];
  TestLog *testLog;
  ResultCollector status;
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_> outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *this_local;
  
  this_00 = this->m_samplings;
  fmt_00 = &(this->m_caseCtx).floatFormat;
  PVar1 = (this->m_caseCtx).precision;
  sVar2 = (this->m_caseCtx).numRandoms;
  inputs.in3.
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_01 = tcu::TestContext::getCommandLine((this->m_caseCtx).testContext);
  iVar5 = tcu::CommandLine::getBaseSeed(this_01);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)&fmt,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt_00,(FloatFormat *)(ulong)PVar1,(Precision)sVar2,(ulong)(iVar5 + 0xdeadbeef),
             in_stack_ffffffffffffeba8);
  iVar5 = numInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                    ();
  iVar6 = numOutputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,2,2>,tcu::Vector<float,2>>>();
  if (iVar5 < 1) {
    local_1230 = (pointer)0x1;
  }
  else {
    local_1230 = (pointer)std::
                          vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                          size((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                *)&fmt);
  }
  outputs.out1.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_1230;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>::Outputs
            ((Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
              *)&highpFmt.m_maxValue,(size_t)local_1230);
  highpFmt._24_8_ = (this->m_caseCtx).highpFormat.m_maxValue;
  numErrors = (this->m_caseCtx).highpFormat.m_minExp;
  unique0x100010cb = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)((long)&status.m_message.field_2 + 8));
  tcu::ResultCollector::ResultCollector((ResultCollector *)&testLog);
  this_02 = Context::getTestContext((this->super_TestInstance).m_context);
  this_03 = tcu::TestContext::getLog(this_02);
  outputArr[1] = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::front
                           ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&fmt);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::front
            ((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_> *)
             &inputs.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b8 = std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
              front((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_> *)
                    &highpFmt.m_maxValue);
  outputArr[0] = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::front
                           ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&outputs.out0.
                                super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::TestLog::operator<<(&local_338,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [12])"Statement: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_stmt);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         *)&it);
  pSVar8 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                     (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
  Statement::getUsedFuncs
            (pSVar8,(set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                     *)&it);
  local_4e8._M_node =
       (_Base_ptr)
       std::
       set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
       ::begin((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
  while( true ) {
    local_4f0._M_node =
         (_Base_ptr)
         std::
         set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
         ::end((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                *)&it);
    bVar4 = std::operator!=(&local_4e8,&local_4f0);
    if (!bVar4) break;
    ppFVar9 = std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator*
                        (&local_4e8);
    FuncBase::printDefinition
              (*ppFVar9,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>::operator++(&local_4e8);
  }
  bVar4 = std::
          set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          ::empty((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
                   *)&it);
  if (!bVar4) {
    tcu::TestLog::operator<<(&local_670,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_670,(char (*) [24])"Reference definitions:\n");
    std::__cxx11::ostringstream::str();
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_690);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_690);
    tcu::MessageBuilder::~MessageBuilder(&local_670);
  }
  std::
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~set((set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          *)&it);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  switch(iVar5) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    pSVar10 = de::details::
              UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
              ::operator->(&(this->m_executor).
                            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                          );
    pVVar3 = outputs.out1.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    value_01 = (IVal *)&local_1b8;
    ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&in0.m_data[1].m_hi,0);
    (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,(ulong)pVVar3 & 0xffffffff,outputArr + 1);
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_6c8);
    Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 7));
    Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 6));
    Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 5));
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix
              ((Matrix<tcu::Interval,_2,_2> *)&reference1.m_data[1].m_hi);
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)&valueNdx);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                        ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_> *)
                         &this->m_variables);
    Environment::bind<tcu::Vector<float,2>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11,(IVal *)local_6c8);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 7));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 6));
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::bind<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12,
               (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 5));
    pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>::
              operator*(&(this->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                       );
    Environment::bind<tcu::Matrix<float,2,2>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13,
               (IVal *)&reference1.m_data[1].m_hi);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                        (&(this->m_variables).out1.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                        );
    Environment::bind<tcu::Vector<float,2>>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11,(IVal *)&valueNdx);
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix
              ((Matrix<tcu::Interval,_2,_2> *)&reference1.m_data[1].m_hi);
    pVStack_768 = (pointer)0x0;
  }
  do {
    if (outputs.out1.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= pVStack_768) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        tcu::TestLog::operator<<(&local_e58,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_e58,(char (*) [10])"(Skipped ");
        local_e5c = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_e5c);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_e58);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        tcu::TestLog::operator<<(&local_fe0,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_fe0,(char (*) [5])"All ");
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_fe0);
      }
      else {
        tcu::TestLog::operator<<(&local_1160,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_1160,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x12f5e0e);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1160);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_11e8,"Pass",&local_11e9)
        ;
        tcu::TestStatus::pass(__return_storage_ptr__,&local_11e8);
        std::__cxx11::string::~string((string *)&local_11e8);
        std::allocator<char>::~allocator(&local_11e9);
      }
      else {
        de::toString<int>(&local_11a0,
                          (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11c0," test failed. Check log for the details",&local_11c1);
        std::operator+(&local_1180,&local_11a0,&local_11c0);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1180);
        std::__cxx11::string::~string((string *)&local_1180);
        std::__cxx11::string::~string((string *)&local_11c0);
        std::allocator<char>::~allocator(&local_11c1);
        std::__cxx11::string::~string((string *)&local_11a0);
      }
      local_11c8 = 1;
      tcu::ResultCollector::~ResultCollector((ResultCollector *)&testLog);
      Environment::~Environment((Environment *)((long)&status.m_message.field_2 + 8));
      Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>::
      ~Outputs((Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
                *)&highpFmt.m_maxValue);
      Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ::~Inputs((Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *)&fmt);
      return __return_storage_ptr__;
    }
    reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ = 1;
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_7d0);
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)auStack_808);
    pFVar14 = (FloatFormat *)
              std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &fmt,(size_type)pVStack_768);
    round<tcu::Vector<float,2>>
              (&local_868,(shaderexecutor *)fmt_00,pFVar14,(Vector<float,_2> *)value_01);
    convert<tcu::Vector<float,2>>
              (&local_838,(shaderexecutor *)fmt_00,(FloatFormat *)&local_868,(IVal *)value_01);
    pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                        ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_> *)
                         &this->m_variables);
    pIVar15 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11);
    pIVar15->m_data[1].m_lo = local_838.m_data[1].m_lo;
    pIVar15->m_data[1].m_hi = local_838.m_data[1].m_hi;
    pIVar15->m_data[0].m_hi = local_838.m_data[0].m_hi;
    pIVar15->m_data[1].m_hasNaN = local_838.m_data[1].m_hasNaN;
    *(undefined7 *)&pIVar15->m_data[1].field_0x1 = local_838.m_data[1]._1_7_;
    pIVar15->m_data[0].m_hasNaN = local_838.m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar15->m_data[0].field_0x1 = local_838.m_data[0]._1_7_;
    pIVar15->m_data[0].m_lo = local_838.m_data[0].m_lo;
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_768);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,local_86a);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in1.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_768);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,local_86e);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in2.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>::
              operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          *)&inputs.in2.
                             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (size_type)pVStack_768);
    round<vkt::shaderexecutor::Void>(fmt_00,pvVar16);
    convert<vkt::shaderexecutor::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
              operator*(&(this->m_variables).in3.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                       );
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)((long)&status.m_message.field_2 + 8),pVVar12);
    value_01 = (IVal *)((long)&status.m_message.field_2 + 8);
    EvalContext::EvalContext
              ((EvalContext *)local_8b8,fmt_00,(this->m_caseCtx).precision,(Environment *)value_01,0
              );
    pSVar8 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->
                       (&(this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>);
    Statement::execute(pSVar8,(EvalContext *)local_8b8);
    if (iVar6 == 1) {
LAB_0109d9ef:
      pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>::
                operator*(&(this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                         );
      pFVar14 = (FloatFormat *)
                Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar13);
      convert<tcu::Matrix<float,2,2>>(&local_970,(shaderexecutor *)&numErrors,pFVar14,value_01);
      tcu::Matrix<tcu::Interval,_2,_2>::operator=
                ((Matrix<tcu::Interval,_2,_2> *)local_7d0,&local_970);
      tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_970);
      value_00 = std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
                 operator[]((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                             *)&highpFmt.m_maxValue,(size_type)pVStack_768);
      bVar4 = contains<tcu::Matrix<float,2,2>>((IVal *)local_7d0,value_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_990,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.field_0x17f);
      bVar4 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar4,&local_990);
      std::__cxx11::string::~string((string *)&local_990);
      std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ = 0;
      }
    }
    else if (iVar6 == 2) {
      pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::
                operator*(&(this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         );
      pFVar14 = (FloatFormat *)
                Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)((long)&status.m_message.field_2 + 8),pVVar11);
      convert<tcu::Vector<float,2>>
                ((IVal *)local_8e8,(shaderexecutor *)&numErrors,pFVar14,(IVal *)value_01);
      reference1_1.m_data[1]._0_8_ = local_8c8;
      reference1_1.m_data[1].m_lo = dStack_8c0;
      reference1_1.m_data[0].m_lo = (double)local_8e8._16_8_;
      reference1_1.m_data[0].m_hi = (double)local_8e8._24_8_;
      auStack_808 = (undefined1  [8])local_8e8._0_8_;
      reference1_1.m_data[0]._0_8_ = local_8e8._8_8_;
      value = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pVStack_768)
      ;
      bVar4 = contains<tcu::Vector<float,2>>((IVal *)auStack_808,value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_908,"Shader output 1 is outside acceptable range",&local_909);
      bVar4 = tcu::ResultCollector::check((ResultCollector *)&testLog,bVar4,&local_908);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator(&local_909);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ = 0;
      }
      goto LAB_0109d9ef;
    }
    if ((reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ & 1) == 0) {
      env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    if (((reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ & 1) == 0) &&
       ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      tcu::TestLog::message((MessageBuilder *)local_b18,this_03);
      if ((reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ & 1) == 0) {
        local_12f8 = (char (*) [7])0x13074da;
      }
      else {
        local_12f8 = (char (*) [7])0x13074e1;
      }
      pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_b18,local_12f8);
      tcu::MessageBuilder::operator<<(pMVar7,(char (*) [10])" sample:\n");
      if (0 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b18,(char (*) [2])0x12f6f82);
        pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::
                  operator->((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                              *)&this->m_variables);
        Variable<tcu::Vector<float,2>>::getName_abi_cxx11_(&local_b38,pVVar11);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b38);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136d034);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)&fmt,(size_type)pVStack_768);
        valueToString<tcu::Vector<float,2>>
                  (&local_b58,(shaderexecutor *)&numErrors,pFVar14,(Vector<float,_2> *)value_01);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b58);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_b58);
        std::__cxx11::string::~string((string *)&local_b38);
      }
      if (1 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b18,(char (*) [2])0x12f6f82);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_b78,pVVar12);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b78);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136d034);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in0.
                                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_768);
        valueToString<vkt::shaderexecutor::Void>(&local_b98,(FloatFormat *)&numErrors,pvVar16);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b98);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_b98);
        std::__cxx11::string::~string((string *)&local_b78);
      }
      if (2 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b18,(char (*) [2])0x12f6f82);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in2.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_bb8,pVVar12);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_bb8);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136d034);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in1.
                                   super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_768);
        valueToString<vkt::shaderexecutor::Void>(&local_bd8,(FloatFormat *)&numErrors,pvVar16);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_bd8);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_bd8);
        std::__cxx11::string::~string((string *)&local_bb8);
      }
      if (3 < iVar5) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b18,(char (*) [2])0x12f6f82);
        pVVar12 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
                  operator->(&(this->m_variables).in3.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                            );
        Variable<vkt::shaderexecutor::Void>::getName_abi_cxx11_(&local_bf8,pVVar12);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_bf8);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136d034);
        pvVar16 = std::vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                  ::operator[]((vector<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                *)&inputs.in2.
                                   super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_768);
        valueToString<vkt::shaderexecutor::Void>(&local_c18,(FloatFormat *)&numErrors,pvVar16);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c18);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_c18);
        std::__cxx11::string::~string((string *)&local_bf8);
      }
      if (0 < iVar6) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b18,(char (*) [2])0x12f6f82);
        pVVar13 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>::
                  operator->(&(this->m_variables).out0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                            );
        Variable<tcu::Matrix<float,2,2>>::getName_abi_cxx11_(&local_c38,pVVar13);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c38);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136d034);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                *)&highpFmt.m_maxValue,(size_type)pVStack_768);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_c58,(shaderexecutor *)&numErrors,pFVar14,(Matrix<float,_2,_2> *)value_01);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c58);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_c78,(shaderexecutor *)&numErrors,(FloatFormat *)local_7d0,value_01);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c78);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_c78);
        std::__cxx11::string::~string((string *)&local_c58);
        std::__cxx11::string::~string((string *)&local_c38);
      }
      if (1 < iVar6) {
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_b18,(char (*) [2])0x12f6f82);
        pVVar11 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::
                  operator->(&(this->m_variables).out1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                            );
        Variable<tcu::Vector<float,2>>::getName_abi_cxx11_(&local_c98,pVVar11);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_c98);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136d034);
        pFVar14 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)&outputs.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)pVStack_768);
        valueToString<tcu::Vector<float,2>>
                  (&local_cb8,(shaderexecutor *)&numErrors,pFVar14,(Vector<float,_2> *)value_01);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_cb8);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Vector<float,2>>
                  (&local_cd8,(shaderexecutor *)&numErrors,(FloatFormat *)auStack_808,
                   (IVal *)value_01);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_cd8);
        tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x1387264);
        std::__cxx11::string::~string((string *)&local_cd8);
        std::__cxx11::string::~string((string *)&local_cb8);
        std::__cxx11::string::~string((string *)&local_c98);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_b18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_b18);
    }
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix((Matrix<tcu::Interval,_2,_2> *)local_7d0);
    pVStack_768 = (pointer)((long)pVStack_768->m_data + 1);
  } while( true );
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}